

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O2

void __thiscall UUID_ParseStringBadLength_Test::TestBody(UUID_ParseStringBadLength_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper local_d0;
  uuid __1;
  AssertionResult gtest_ar_;
  string local_90;
  undefined4 local_6c;
  string input1;
  uuid _;
  maybe<pstore::uuid,_void> v1;
  
  std::__cxx11::string::string
            ((string *)&input1,"00000000-0000-0000-0000-00000000000000",(allocator *)&local_90);
  pstore::uuid::from_string(&v1,&input1);
  gtest_ar_.success_ = (bool)(v1.valid_ ^ 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (v1.valid_ != false) {
    testing::Message::Message((Message *)&__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)&gtest_ar_,(AssertionResult *)"v1.has_value ()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x3d,local_90._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&_,(Message *)&__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&_);
    std::__cxx11::string::~string((string *)&local_90);
    if (__1.data_._M_elems._0_8_ != 0) {
      (**(code **)(*(long *)__1.data_._M_elems._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  pstore::get_error_category();
  local_90.field_2._M_allocated_capacity = 0;
  local_90.field_2._8_8_ = 0;
  local_90._M_string_length = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    pstore::uuid::uuid(&_,&input1);
  }
  std::__cxx11::string::assign((char *)&local_90);
  testing::Message::Message((Message *)&gtest_ar_);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&__1,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,local_90._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=((AssertHelper *)&__1,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__1);
  if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&input1);
  std::__cxx11::string::string
            ((string *)&input1,"00000000-0000-0000-0000-0000000000",(allocator *)&local_90);
  pstore::uuid::from_string(&v1,&input1);
  gtest_ar_.success_ = (bool)(v1.valid_ ^ 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (v1.valid_ != false) {
    testing::Message::Message((Message *)&__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)&gtest_ar_,(AssertionResult *)"v2.has_value ()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x45,local_90._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&__1);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    if (__1.data_._M_elems._0_8_ != 0) {
      (**(code **)(*(long *)__1.data_._M_elems._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  pstore::get_error_category();
  local_6c = 0xf;
  local_90.field_2._M_allocated_capacity = 0;
  local_90.field_2._8_8_ = 0;
  local_90._M_string_length = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    pstore::uuid::uuid(&__1,&input1);
  }
  std::__cxx11::string::assign((char *)&local_90);
  testing::Message::Message((Message *)&gtest_ar_);
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,local_90._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_d0,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&input1);
  return;
}

Assistant:

TEST (UUID, ParseStringBadLength) {
    {
        std::string const input1 = "00000000-0000-0000-0000-00000000000000";
        pstore::maybe<pstore::uuid> v1 = pstore::uuid::from_string (input1);
        EXPECT_FALSE (v1.has_value ());

        check_for_error ([&input1] () { pstore::uuid _ (input1); },
                         pstore::error_code::uuid_parse_error);
    }
    {
        std::string const input2 = "00000000-0000-0000-0000-0000000000";
        pstore::maybe<pstore::uuid> v2 = pstore::uuid::from_string (input2);
        EXPECT_FALSE (v2.has_value ());

        check_for_error ([&input2] () { pstore::uuid _ (input2); },
                         pstore::error_code::uuid_parse_error);
    }
}